

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::ChompSetBoundedInst::Exec
          (ChompSetBoundedInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  CharCount CVar1;
  uint uVar2;
  bool local_6d;
  uint local_6c;
  CharCount inputEndOffset;
  CharCountOrFlag repeatsUpper;
  CharCount loopMatchStart;
  RuntimeCharSet<char16_t> *matchSet;
  bool firstIteration_local;
  CharCount *inputOffset_local;
  CharCount *matchStart_local;
  CharCount inputLength_local;
  Char *input_local;
  Matcher *matcher_local;
  ChompSetBoundedInst *this_local;
  
  CVar1 = *inputOffset;
  uVar2 = (this->super_ChompBoundedMixin).repeats.upper;
  local_6c = inputLength;
  if (uVar2 < inputLength - *inputOffset) {
    local_6c = *inputOffset + uVar2;
  }
  Matcher::CompStats(matcher);
  while( true ) {
    local_6d = false;
    if (*inputOffset < local_6c) {
      local_6d = RuntimeCharSet<char16_t>::Get
                           (&(this->super_SetMixin<false>).set,input[*inputOffset]);
    }
    if (local_6d == false) break;
    Matcher::CompStats(matcher);
    *inputOffset = *inputOffset + 1;
  }
  if (*inputOffset - CVar1 < (this->super_ChompBoundedMixin).repeats.lower) {
    this_local._7_1_ =
         Matcher::Fail(matcher,input,inputOffset,instPointer,contStack,assertionStack,qcTicks);
  }
  else {
    *instPointer = *instPointer + 0x31;
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline bool ChompSetBoundedInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        const RuntimeCharSet<Char>& matchSet = this->set;
        const CharCount loopMatchStart = inputOffset;
        const CharCountOrFlag repeatsUpper = repeats.upper;
        const CharCount inputEndOffset =
            static_cast<CharCount>(repeatsUpper) >= inputLength - inputOffset
                ? inputLength
                : inputOffset + static_cast<CharCount>(repeatsUpper);
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        while (inputOffset < inputEndOffset && matchSet.Get(input[inputOffset]))
        {
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.CompStats();
#endif
            inputOffset++;
        }

        if (inputOffset - loopMatchStart < repeats.lower)
        {
            return matcher.Fail(FAIL_PARAMETERS);
        }

        instPointer += sizeof(*this);
        return false;
    }